

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O2

_Bool bp_wp_matches(ARMCPU_conflict1 *cpu,int n,_Bool is_wp)

{
  CPUARMState_conflict *env;
  CPUWatchpoint *pCVar1;
  CPUBreakpoint *pCVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  uint uVar10;
  long lVar11;
  
  env = &cpu->env;
  _Var3 = arm_is_secure(env);
  iVar4 = arm_current_el(env);
  if ((int)CONCAT71(in_register_00000011,is_wp) == 0) {
    if ((cpu->env).aarch64 == 0) {
      uVar6 = (ulong)(cpu->env).regs[0xf];
    }
    else {
      uVar6 = (cpu->env).pc;
    }
    pCVar2 = (cpu->env).cpu_breakpoint[n];
    if ((pCVar2 != (CPUBreakpoint *)0x0) && (pCVar2->pc == uVar6)) {
      uVar6 = (cpu->env).cp15.dbgbcr[n];
      switch((uint)(uVar6 >> 0xe) & 3) {
      case 0:
        break;
      default:
switchD_005a2410_caseD_1:
        if (_Var3) goto LAB_005a2594;
        break;
      case 2:
switchD_005a2410_caseD_2:
        if (!_Var3) goto LAB_005a2594;
      }
switchD_005a2410_caseD_0:
      uVar10 = (uint)uVar6;
      if (iVar4 - 2U < 2) {
        if ((uVar10 >> 0xd & 1) != 0) goto LAB_005a24bc;
      }
      else {
        if (iVar4 == 0) {
          uVar6 = uVar6 & 4;
        }
        else {
          if (iVar4 != 1) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/debug_helper.c"
                       ,0xb8,(char *)0x0);
          }
          uVar6 = uVar6 & 2;
        }
        if (uVar6 != 0) {
LAB_005a24bc:
          if ((uVar10 >> 0x14 & 1) != 0) {
            uVar10 = uVar10 >> 0x10 & 0xf;
            if (((cpu->env).features & 0x10000000) == 0) {
              uVar8 = (cpu->isar).dbgdidr;
              uVar9 = uVar8 >> 0x18;
              uVar8 = uVar8 >> 0x14 & 0xf;
            }
            else {
              uVar8 = (uint)(cpu->isar).id_aa64dfr0;
              uVar9 = uVar8 >> 0xc;
              uVar8 = uVar8 >> 0x1c;
            }
            iVar5 = 0;
            if (((uVar9 & 0xf) < uVar10) || ((int)uVar10 < (int)((uVar9 & 0xf) - uVar8)))
            goto LAB_005a2596;
            uVar6 = (cpu->env).cp15.dbgbcr[uVar10];
            if ((uVar6 & 1) == 0) goto LAB_005a2594;
            uVar8 = (uint)(uVar6 >> 0x14) & 0xf;
            uVar7 = arm_hcr_el2_eff_aarch64(env);
            if (uVar8 == 0xd) {
              lVar11 = 0xa850;
            }
            else {
              lVar11 = 0xa848;
              if (uVar8 != 7) {
                if (uVar8 != 3) goto LAB_005a2594;
                iVar4 = arm_current_el(env);
                if (iVar4 == 0) {
                  lVar11 = (ulong)((~uVar7 & 0x408000000) == 0) * 8 + 0xa848;
                }
                else if ((iVar4 != 1) &&
                        ((iVar4 != 2 || (lVar11 = 0xa850, (uVar7 & 0x400000000) == 0))))
                goto LAB_005a2594;
              }
            }
            if (*(int *)((long)(cpu->parent_obj).jmp_env[0].__jmpbuf + lVar11 + -0x40) !=
                (int)(cpu->env).cp15.dbgbvr[uVar10]) goto LAB_005a2594;
          }
          iVar5 = 1;
          goto LAB_005a2596;
        }
      }
    }
  }
  else {
    pCVar1 = (cpu->env).cpu_watchpoint[n];
    if (pCVar1 != (CPUWatchpoint *)0x0) {
      iVar5 = 0;
      if ((pCVar1->flags & 0xc0) == 0) goto LAB_005a2596;
      if (((uint)pCVar1->hitattrs & 4) == 0) {
        iVar5 = iVar4;
      }
      iVar4 = iVar5;
      uVar6 = (cpu->env).cp15.dbgwcr[n];
      switch((uint)(uVar6 >> 0xe) & 3) {
      case 0:
        goto switchD_005a2410_caseD_0;
      default:
        goto switchD_005a2410_caseD_1;
      case 2:
        goto switchD_005a2410_caseD_2;
      }
    }
  }
LAB_005a2594:
  iVar5 = 0;
LAB_005a2596:
  return SUB41(iVar5,0);
}

Assistant:

static bool bp_wp_matches(ARMCPU *cpu, int n, bool is_wp)
{
    CPUARMState *env = &cpu->env;
    uint64_t cr;
    int pac, hmc, ssc, wt, lbn;
    /*
     * Note that for watchpoints the check is against the CPU security
     * state, not the S/NS attribute on the offending data access.
     */
    bool is_secure = arm_is_secure(env);
    int access_el = arm_current_el(env);

    if (is_wp) {
        CPUWatchpoint *wp = env->cpu_watchpoint[n];

        if (!wp || !(wp->flags & BP_WATCHPOINT_HIT)) {
            return false;
        }
        cr = env->cp15.dbgwcr[n];
        if (wp->hitattrs.user) {
            /*
             * The LDRT/STRT/LDT/STT "unprivileged access" instructions should
             * match watchpoints as if they were accesses done at EL0, even if
             * the CPU is at EL1 or higher.
             */
            access_el = 0;
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];

        if (!env->cpu_breakpoint[n] || env->cpu_breakpoint[n]->pc != pc) {
            return false;
        }
        cr = env->cp15.dbgbcr[n];
    }
    /*
     * The WATCHPOINT_HIT flag guarantees us that the watchpoint is
     * enabled and that the address and access type match; for breakpoints
     * we know the address matched; check the remaining fields, including
     * linked breakpoints. We rely on WCR and BCR having the same layout
     * for the LBN, SSC, HMC, PAC/PMC and is-linked fields.
     * Note that some combinations of {PAC, HMC, SSC} are reserved and
     * must act either like some valid combination or as if the watchpoint
     * were disabled. We choose the former, and use this together with
     * the fact that EL3 must always be Secure and EL2 must always be
     * Non-Secure to simplify the code slightly compared to the full
     * table in the ARM ARM.
     */
    pac = extract64(cr, 1, 2);
    hmc = extract64(cr, 13, 1);
    ssc = extract64(cr, 14, 2);

    switch (ssc) {
    case 0:
        break;
    case 1:
    case 3:
        if (is_secure) {
            return false;
        }
        break;
    case 2:
        if (!is_secure) {
            return false;
        }
        break;
    }

    switch (access_el) {
    case 3:
    case 2:
        if (!hmc) {
            return false;
        }
        break;
    case 1:
        if (extract32(pac, 0, 1) == 0) {
            return false;
        }
        break;
    case 0:
        if (extract32(pac, 1, 1) == 0) {
            return false;
        }
        break;
    default:
        g_assert_not_reached();
    }

    wt = extract64(cr, 20, 1);
    lbn = extract64(cr, 16, 4);

    if (wt && !linked_bp_matches(cpu, lbn)) {
        return false;
    }

    return true;
}